

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

void __thiscall
icu_63::DateTimeMatcher::set
          (DateTimeMatcher *this,UnicodeString *pattern,FormatParser *fp,PtnSkeleton *skeletonResult
          )

{
  int8_t iVar1;
  char cVar2;
  short sVar3;
  int32_t field;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  UBool UVar11;
  uint uVar12;
  long lVar13;
  short sVar14;
  char16_t cVar15;
  UnicodeString *s;
  undefined **ppuVar16;
  int iVar17;
  int32_t *piVar18;
  undefined1 *puVar19;
  UnicodeString quoteLiteral;
  int local_b4;
  _func_int **local_b0;
  undefined1 *local_a8;
  int32_t *local_a0;
  int8_t *local_98;
  SkeletonFields *local_90;
  SkeletonFields *local_88;
  PtnSkeleton *local_80;
  DateTimeMatcher *local_78;
  UnicodeString local_70;
  
  piVar18 = skeletonResult->type;
  for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
    piVar18[lVar13] = 0;
  }
  local_90 = &skeletonResult->original;
  local_88 = &skeletonResult->baseOriginal;
  (skeletonResult->baseOriginal).lengths[0] = '\0';
  (skeletonResult->baseOriginal).lengths[1] = '\0';
  (skeletonResult->baseOriginal).lengths[2] = '\0';
  (skeletonResult->baseOriginal).lengths[3] = '\0';
  (skeletonResult->baseOriginal).lengths[4] = '\0';
  (skeletonResult->baseOriginal).lengths[5] = '\0';
  (skeletonResult->baseOriginal).lengths[6] = '\0';
  (skeletonResult->baseOriginal).lengths[7] = '\0';
  (skeletonResult->baseOriginal).lengths[8] = '\0';
  (skeletonResult->baseOriginal).lengths[9] = '\0';
  (skeletonResult->baseOriginal).lengths[10] = '\0';
  (skeletonResult->baseOriginal).lengths[0xb] = '\0';
  (skeletonResult->baseOriginal).lengths[0xc] = '\0';
  (skeletonResult->baseOriginal).lengths[0xd] = '\0';
  (skeletonResult->baseOriginal).lengths[0xe] = '\0';
  (skeletonResult->baseOriginal).lengths[0xf] = '\0';
  (skeletonResult->baseOriginal).chars[0] = '\0';
  (skeletonResult->baseOriginal).chars[1] = '\0';
  (skeletonResult->baseOriginal).chars[2] = '\0';
  (skeletonResult->baseOriginal).chars[3] = '\0';
  (skeletonResult->baseOriginal).chars[4] = '\0';
  (skeletonResult->baseOriginal).chars[5] = '\0';
  (skeletonResult->baseOriginal).chars[6] = '\0';
  (skeletonResult->baseOriginal).chars[7] = '\0';
  (skeletonResult->baseOriginal).chars[8] = '\0';
  (skeletonResult->baseOriginal).chars[9] = '\0';
  (skeletonResult->baseOriginal).chars[10] = '\0';
  (skeletonResult->baseOriginal).chars[0xb] = '\0';
  (skeletonResult->baseOriginal).chars[0xc] = '\0';
  (skeletonResult->baseOriginal).chars[0xd] = '\0';
  (skeletonResult->baseOriginal).chars[0xe] = '\0';
  (skeletonResult->baseOriginal).chars[0xf] = '\0';
  (skeletonResult->original).lengths[0] = '\0';
  (skeletonResult->original).lengths[1] = '\0';
  (skeletonResult->original).lengths[2] = '\0';
  (skeletonResult->original).lengths[3] = '\0';
  (skeletonResult->original).lengths[4] = '\0';
  (skeletonResult->original).lengths[5] = '\0';
  (skeletonResult->original).lengths[6] = '\0';
  (skeletonResult->original).lengths[7] = '\0';
  (skeletonResult->original).lengths[8] = '\0';
  (skeletonResult->original).lengths[9] = '\0';
  (skeletonResult->original).lengths[10] = '\0';
  (skeletonResult->original).lengths[0xb] = '\0';
  (skeletonResult->original).lengths[0xc] = '\0';
  (skeletonResult->original).lengths[0xd] = '\0';
  (skeletonResult->original).lengths[0xe] = '\0';
  (skeletonResult->original).lengths[0xf] = '\0';
  (skeletonResult->original).chars[0] = '\0';
  (skeletonResult->original).chars[1] = '\0';
  (skeletonResult->original).chars[2] = '\0';
  (skeletonResult->original).chars[3] = '\0';
  (skeletonResult->original).chars[4] = '\0';
  (skeletonResult->original).chars[5] = '\0';
  (skeletonResult->original).chars[6] = '\0';
  (skeletonResult->original).chars[7] = '\0';
  (skeletonResult->original).chars[8] = '\0';
  (skeletonResult->original).chars[9] = '\0';
  (skeletonResult->original).chars[10] = '\0';
  (skeletonResult->original).chars[0xb] = '\0';
  (skeletonResult->original).chars[0xc] = '\0';
  (skeletonResult->original).chars[0xd] = '\0';
  (skeletonResult->original).chars[0xe] = '\0';
  (skeletonResult->original).chars[0xf] = '\0';
  skeletonResult->addedDefaultDayPeriod = '\0';
  local_78 = this;
  FormatParser::set(fp,pattern);
  puVar19 = &fp->field_0x8;
  local_98 = (skeletonResult->baseOriginal).lengths;
  ppuVar16 = &PTR__UnicodeString_00471e80;
  local_b0 = (_func_int **)&PTR__UnicodeString_00471e80;
  local_a8 = puVar19;
  local_a0 = piVar18;
  local_80 = skeletonResult;
  for (iVar17 = 0; iVar17 < fp->itemNumber; iVar17 = iVar17 + 1) {
    s = (UnicodeString *)(puVar19 + (long)iVar17 * 0x40);
    local_b4 = iVar17;
    UVar11 = FormatParser::isQuoteLiteral(s);
    if (UVar11 == '\0') {
      uVar12 = FormatParser::getCanonicalIndex(s);
      if (-1 < (int)uVar12) {
        lVar13 = (ulong)uVar12 * 0x10;
        field = *(int32_t *)(&DAT_003810c4 + lVar13);
        SkeletonFields::populate(local_90,field,s);
        iVar1 = (&DAT_003810ca)[lVar13];
        local_88->chars[field] = *(int8_t *)(&dtTypes + (ulong)uVar12 * 8);
        local_98[field] = iVar1;
        sVar14 = *(short *)(&DAT_003810c8 + lVar13);
        if (0 < sVar14) {
          sVar3 = (s->fUnion).fStackFields.fLengthAndFlags;
          if (sVar3 < 0) {
            cVar15 = (s->fUnion).fStackFields.fBuffer[1];
          }
          else {
            cVar15 = (char16_t)((uint)(int)sVar3 >> 5);
          }
          sVar14 = sVar14 + cVar15;
        }
        local_a0[field] = (int)sVar14;
        ppuVar16 = local_b0;
        piVar18 = local_a0;
        puVar19 = local_a8;
      }
    }
    else {
      local_70.fUnion.fStackFields.fLengthAndFlags = 2;
      local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)(UObject)ppuVar16;
      FormatParser::getQuoteLiteral(fp,&local_70,&local_b4);
      icu_63::UnicodeString::~UnicodeString(&local_70);
      iVar17 = local_b4;
    }
  }
  if ((local_80->original).lengths[0xb] != '\0') {
    cVar2 = (local_80->original).chars[0xb];
    if ((cVar2 == 'h') || (cVar2 == 'K')) {
      if ((local_80->original).lengths[10] == '\0') {
        (local_80->original).chars[10] = 'a';
        (local_80->original).lengths[10] = '\x01';
        (local_80->baseOriginal).chars[10] = 'a';
        (local_80->baseOriginal).lengths[10] = '\x01';
        local_80->type[10] = -0x103;
        local_80->addedDefaultDayPeriod = '\x01';
      }
    }
    else {
      (local_80->original).chars[10] = '\0';
      (local_80->original).lengths[10] = '\0';
      (local_80->baseOriginal).chars[10] = '\0';
      (local_80->baseOriginal).lengths[10] = '\0';
      local_80->type[10] = 0;
    }
  }
  uVar4 = *(undefined8 *)piVar18;
  uVar5 = *(undefined8 *)(piVar18 + 2);
  uVar6 = *(undefined8 *)(piVar18 + 4);
  uVar7 = *(undefined8 *)(piVar18 + 6);
  uVar8 = *(undefined8 *)(piVar18 + 8);
  uVar9 = *(undefined8 *)(piVar18 + 10);
  uVar10 = *(undefined8 *)(piVar18 + 0xe);
  *(undefined8 *)((local_78->skeleton).type + 0xc) = *(undefined8 *)(piVar18 + 0xc);
  *(undefined8 *)((local_78->skeleton).type + 0xe) = uVar10;
  *(undefined8 *)((local_78->skeleton).type + 8) = uVar8;
  *(undefined8 *)((local_78->skeleton).type + 10) = uVar9;
  *(undefined8 *)((local_78->skeleton).type + 4) = uVar6;
  *(undefined8 *)((local_78->skeleton).type + 6) = uVar7;
  *(undefined8 *)(local_78->skeleton).type = uVar4;
  *(undefined8 *)((local_78->skeleton).type + 2) = uVar5;
  uVar4 = *(undefined8 *)(local_90->chars + 8);
  *(undefined8 *)(local_78->skeleton).original.chars = *(undefined8 *)local_90->chars;
  *(undefined8 *)((local_78->skeleton).original.chars + 8) = uVar4;
  uVar4 = *(undefined8 *)((local_80->original).lengths + 8);
  *(undefined8 *)(local_78->skeleton).original.lengths = *(undefined8 *)(local_80->original).lengths
  ;
  *(undefined8 *)((local_78->skeleton).original.lengths + 8) = uVar4;
  uVar4 = *(undefined8 *)(local_88->chars + 8);
  *(undefined8 *)(local_78->skeleton).baseOriginal.chars = *(undefined8 *)local_88->chars;
  *(undefined8 *)((local_78->skeleton).baseOriginal.chars + 8) = uVar4;
  uVar4 = *(undefined8 *)(local_98 + 8);
  *(undefined8 *)(local_78->skeleton).baseOriginal.lengths = *(undefined8 *)local_98;
  *(undefined8 *)((local_78->skeleton).baseOriginal.lengths + 8) = uVar4;
  return;
}

Assistant:

void
DateTimeMatcher::set(const UnicodeString& pattern, FormatParser* fp, PtnSkeleton& skeletonResult) {
    int32_t i;
    for (i=0; i<UDATPG_FIELD_COUNT; ++i) {
        skeletonResult.type[i] = NONE;
    }
    skeletonResult.original.clear();
    skeletonResult.baseOriginal.clear();
    skeletonResult.addedDefaultDayPeriod = FALSE;

    fp->set(pattern);
    for (i=0; i < fp->itemNumber; i++) {
        const UnicodeString& value = fp->items[i];
        // don't skip 'a' anymore, dayPeriod handled specially below

        if ( fp->isQuoteLiteral(value) ) {
            UnicodeString quoteLiteral;
            fp->getQuoteLiteral(quoteLiteral, &i);
            continue;
        }
        int32_t canonicalIndex = fp->getCanonicalIndex(value);
        if (canonicalIndex < 0) {
            continue;
        }
        const dtTypeElem *row = &dtTypes[canonicalIndex];
        int32_t field = row->field;
        skeletonResult.original.populate(field, value);
        UChar repeatChar = row->patternChar;
        int32_t repeatCount = row->minLen;
        skeletonResult.baseOriginal.populate(field, repeatChar, repeatCount);
        int16_t subField = row->type;
        if (row->type > 0) {
            U_ASSERT(value.length() < INT16_MAX);
            subField += static_cast<int16_t>(value.length());
        }
        skeletonResult.type[field] = subField;
    }
    // #13183, handle special behavior for day period characters (a, b, B)
    if (!skeletonResult.original.isFieldEmpty(UDATPG_HOUR_FIELD)) {
        if (skeletonResult.original.getFieldChar(UDATPG_HOUR_FIELD)==LOW_H || skeletonResult.original.getFieldChar(UDATPG_HOUR_FIELD)==CAP_K) {
            // We have a skeleton with 12-hour-cycle format
            if (skeletonResult.original.isFieldEmpty(UDATPG_DAYPERIOD_FIELD)) {
                // But we do not have a day period in the skeleton; add the default DAYPERIOD (currently "a")
                for (i = 0; dtTypes[i].patternChar != 0; i++) {
                    if ( dtTypes[i].field == UDATPG_DAYPERIOD_FIELD ) {
                        // first entry for UDATPG_DAYPERIOD_FIELD
                        skeletonResult.original.populate(UDATPG_DAYPERIOD_FIELD, dtTypes[i].patternChar, dtTypes[i].minLen);
                        skeletonResult.baseOriginal.populate(UDATPG_DAYPERIOD_FIELD, dtTypes[i].patternChar, dtTypes[i].minLen);
                        skeletonResult.type[UDATPG_DAYPERIOD_FIELD] = dtTypes[i].type;
                        skeletonResult.addedDefaultDayPeriod = TRUE;
                        break;
                    }
                }
            }
        } else {
            // Skeleton has 24-hour-cycle hour format and has dayPeriod, delete dayPeriod (i.e. ignore it)
            skeletonResult.original.clearField(UDATPG_DAYPERIOD_FIELD);
            skeletonResult.baseOriginal.clearField(UDATPG_DAYPERIOD_FIELD);
            skeletonResult.type[UDATPG_DAYPERIOD_FIELD] = NONE;
        }
    }
    copyFrom(skeletonResult);
}